

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBooleanStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_2::ColorMaskTestCase::test(ColorMaskTestCase *this)

{
  GLboolean red;
  GLboolean green;
  GLboolean blue;
  GLboolean alpha;
  int ndx;
  long lVar1;
  
  (*this->m_verifier->_vptr_StateVerifier[3])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xc23,1,1,
             1,1);
  lVar1 = 0;
  ApiCase::expectError(&this->super_ApiCase,0);
  do {
    red = (&DAT_01c16e90)[lVar1 * 4];
    green = (&DAT_01c16e91)[lVar1 * 4];
    blue = (&DAT_01c16e92)[lVar1 * 4];
    alpha = (&DAT_01c16e93)[lVar1 * 4];
    glu::CallLogWrapper::glColorMask
              (&(this->super_ApiCase).super_CallLogWrapper,red,green,blue,alpha);
    (*this->m_verifier->_vptr_StateVerifier[3])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xc23,
               (ulong)(red == '\x01'),(ulong)(green == '\x01'),(ulong)(blue == '\x01'),
               (uint)(alpha == '\x01'));
    ApiCase::expectError(&this->super_ApiCase,0);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyBoolean4(m_testCtx, GL_COLOR_WRITEMASK, true, true, true, true);
		expectError(GL_NO_ERROR);

		const struct ColorMask
		{
			GLboolean r, g, b, a;
		} testMasks[] =
		{
			{ GL_TRUE,	GL_TRUE,	GL_TRUE,	GL_TRUE  },
			{ GL_TRUE,	GL_TRUE,	GL_TRUE,	GL_FALSE },
			{ GL_TRUE,	GL_TRUE,	GL_FALSE,	GL_TRUE  },
			{ GL_TRUE,	GL_TRUE,	GL_FALSE,	GL_FALSE },
			{ GL_TRUE,	GL_FALSE,	GL_TRUE,	GL_TRUE  },
			{ GL_TRUE,	GL_FALSE,	GL_TRUE,	GL_FALSE },
			{ GL_TRUE,	GL_FALSE,	GL_FALSE,	GL_TRUE  },
			{ GL_TRUE,	GL_FALSE,	GL_FALSE,	GL_FALSE },
			{ GL_FALSE,	GL_TRUE,	GL_TRUE,	GL_TRUE  },
			{ GL_FALSE,	GL_TRUE,	GL_TRUE,	GL_FALSE },
			{ GL_FALSE,	GL_TRUE,	GL_FALSE,	GL_TRUE  },
			{ GL_FALSE,	GL_TRUE,	GL_FALSE,	GL_FALSE },
			{ GL_FALSE,	GL_FALSE,	GL_TRUE,	GL_TRUE  },
			{ GL_FALSE,	GL_FALSE,	GL_TRUE,	GL_FALSE },
			{ GL_FALSE,	GL_FALSE,	GL_FALSE,	GL_TRUE  },
			{ GL_FALSE,	GL_FALSE,	GL_FALSE,	GL_FALSE },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(testMasks); ndx++)
		{
			glColorMask(testMasks[ndx].r, testMasks[ndx].g, testMasks[ndx].b, testMasks[ndx].a);
			m_verifier->verifyBoolean4(m_testCtx, GL_COLOR_WRITEMASK, testMasks[ndx].r==GL_TRUE, testMasks[ndx].g==GL_TRUE, testMasks[ndx].b==GL_TRUE, testMasks[ndx].a==GL_TRUE);
			expectError(GL_NO_ERROR);
		}
	}